

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# events.cpp
# Opt level: O3

EventDefinition * findEventByName(String *a)

{
  EventDefinition *this;
  _Elt_pointer ppEVar1;
  _Alloc_hider _Var2;
  int iVar3;
  _Elt_pointer ppEVar4;
  _Elt_pointer ppEVar5;
  _Map_pointer pppEVar6;
  bool bVar7;
  String local_70;
  String local_50;
  
  ppEVar1 = Events._deque.super__Deque_base<EventDefinition_*,_std::allocator<EventDefinition_*>_>.
            _M_impl.super__Deque_impl_data._M_finish._M_cur;
  ppEVar4 = Events._deque.super__Deque_base<EventDefinition_*,_std::allocator<EventDefinition_*>_>.
            _M_impl.super__Deque_impl_data._M_start._M_last;
  ppEVar5 = Events._deque.super__Deque_base<EventDefinition_*,_std::allocator<EventDefinition_*>_>.
            _M_impl.super__Deque_impl_data._M_start._M_cur;
  pppEVar6 = Events._deque.super__Deque_base<EventDefinition_*,_std::allocator<EventDefinition_*>_>.
             _M_impl.super__Deque_impl_data._M_start._M_node;
  if (Events._deque.super__Deque_base<EventDefinition_*,_std::allocator<EventDefinition_*>_>._M_impl
      .super__Deque_impl_data._M_start._M_cur !=
      Events._deque.super__Deque_base<EventDefinition_*,_std::allocator<EventDefinition_*>_>._M_impl
      .super__Deque_impl_data._M_finish._M_cur) {
    do {
      this = *ppEVar5;
      String::toUppercase(&local_70,a);
      String::toUppercase(&local_50,&this->name);
      _Var2._M_p = local_50._string._M_dataplus._M_p;
      if (local_70._string._M_string_length == local_50._string._M_string_length) {
        if (local_70._string._M_string_length == 0) {
          bVar7 = true;
        }
        else {
          iVar3 = bcmp(local_70._string._M_dataplus._M_p,local_50._string._M_dataplus._M_p,
                       local_70._string._M_string_length);
          bVar7 = iVar3 == 0;
        }
      }
      else {
        bVar7 = false;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_Var2._M_p != &local_50._string.field_2) {
        operator_delete(_Var2._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._string._M_dataplus._M_p != &local_70._string.field_2) {
        operator_delete(local_70._string._M_dataplus._M_p);
      }
      if (bVar7) {
        return this;
      }
      ppEVar5 = ppEVar5 + 1;
      if (ppEVar5 == ppEVar4) {
        ppEVar5 = pppEVar6[1];
        pppEVar6 = pppEVar6 + 1;
        ppEVar4 = ppEVar5 + 0x40;
      }
    } while (ppEVar5 != ppEVar1);
  }
  return (EventDefinition *)0x0;
}

Assistant:

EventDefinition* findEventByName (String a)
{
	for (EventDefinition* e : Events)
	{
		if (a.toUppercase() == e->name.toUppercase())
			return e;
	}

	return null;
}